

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

int __thiscall tinyusdz::AttrMetas::get_unauthoredValuesIndex(AttrMetas *this)

{
  bool bVar1;
  mapped_type *this_00;
  int *piVar2;
  int iVar3;
  key_type local_40;
  
  bVar1 = has_unauthoredValuesIndex(this);
  iVar3 = -1;
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"unauthoredValuesIndex","");
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::at(&this->meta,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    piVar2 = tinyusdz::value::Value::as<int>(&this_00->_value,false);
    if (piVar2 != (int *)0x0) {
      iVar3 = *piVar2;
    }
  }
  return iVar3;
}

Assistant:

int AttrMetas::get_unauthoredValuesIndex() const {
  if (!has_unauthoredValuesIndex()) {
    return -1;
  }

  const MetaVariable &mv = meta.at("unauthoredValuesIndex");
  int v;
  if (mv.get_value<int>(&v)) {
    return v;
  }

  return -1;
}